

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O3

char * XPMPLoadCSLPackage(char *inCSLFolder)

{
  size_t sVar1;
  char *pcVar2;
  string local_50;
  string local_30;
  
  if (inCSLFolder == (char *)0x0) {
    pcVar2 = "<nullptr> provided";
  }
  else {
    if (XPMP2::glob < 2) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      sVar1 = strlen(inCSLFolder);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,inCSLFolder,inCSLFolder + sVar1);
      XPMP2::StripXPSysDir(&local_50,&local_30);
      XPMP2::LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
                    ,0xf8,"XPMPLoadCSLPackage",logINFO,"Loading CSL package from %s",
                    local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar1 = strlen(inCSLFolder);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,inCSLFolder,inCSLFolder + sVar1);
    pcVar2 = XPMP2::CSLModelsLoad(&local_50,5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return pcVar2;
}

Assistant:

const char *    XPMPLoadCSLPackage(const char * inCSLFolder)
{
    // Do load the CSL Models in the given path
    if (inCSLFolder) {
        LOG_MSG(logINFO, INFO_LOAD_CSL_PACKAGE, StripXPSysDir(inCSLFolder).c_str());
        return CSLModelsLoad(inCSLFolder);
    }
    else
        return "<nullptr> provided";
}